

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig_conflict *font_cfg_template,ImWchar *glyph_ranges)

{
  uchar *ttf_data;
  long lVar1;
  ImFont *pIVar2;
  ulong uVar3;
  ushort *puVar4;
  ushort *puVar5;
  byte bVar6;
  uint uVar7;
  uchar *puVar8;
  uint ttf_size;
  ImFontConfig_conflict local_b8;
  
  uVar7 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  ttf_data = (uchar *)ImGui::MemAlloc((ulong)ttf_size);
  uVar7 = *compressed_ttf_data;
  if (((uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18) !=
       0x57bc0000) ||
     (uVar7 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar7 >> 0x18 != 0 || (uVar7 & 0xff0000) != 0) || (uVar7 & 0xff00) != 0) ||
     (uVar7 & 0xff) != 0)) {
LAB_0020682d:
    if (font_cfg_template == (ImFontConfig_conflict *)0x0) {
      memset(&local_b8,0,0x88);
      local_b8.OversampleH = L'\x03';
      local_b8.OversampleV = L'\x01';
      local_b8.GlyphMaxAdvanceX = 3.4028235e+38;
      local_b8.RasterizerMultiply = 1.0;
      local_b8.EllipsisChar = 0xffff;
    }
    else {
      memcpy(&local_b8,font_cfg_template,0x88);
      if (local_b8.FontData != (void *)0x0) {
        __assert_fail("font_cfg.FontData == __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0x889,
                      "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                     );
      }
    }
    local_b8.FontDataOwnedByAtlas = true;
    pIVar2 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_b8,glyph_ranges);
    return pIVar2;
  }
  uVar7 = *(uint *)((long)compressed_ttf_data + 8);
  puVar8 = ttf_data +
           (uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
  puVar4 = (ushort *)((long)compressed_ttf_data + 0x10);
  stb__barrier_in_b = (uchar *)compressed_ttf_data;
  stb__barrier_out_e = puVar8;
  stb__barrier_out_b = ttf_data;
  stb__dout = ttf_data;
  do {
    bVar6 = (byte)*puVar4;
    uVar7 = (uint)bVar6;
    if (bVar6 < 0x20) {
      if (bVar6 < 0x18) {
        if (bVar6 < 0x10) {
          if (bVar6 < 8) {
            if (bVar6 != 4) {
              if (uVar7 == 6) {
                uVar3 = ~((ulong)*(byte *)((long)puVar4 + 3) |
                          (ulong)*(byte *)((long)puVar4 + 1) << 0x10 | (ulong)(byte)puVar4[1] << 8);
                uVar7 = (uint)(byte)puVar4[2];
                goto LAB_002066ce;
              }
              if (uVar7 == 7) {
                stb__lit((byte *)((long)puVar4 + 3),
                         (ushort)(*(ushort *)((long)puVar4 + 1) << 8 |
                                 *(ushort *)((long)puVar4 + 1) >> 8) + 1);
                uVar3 = (ulong)(ushort)(*(ushort *)((long)puVar4 + 1) << 8 |
                                       *(ushort *)((long)puVar4 + 1) >> 8);
                lVar1 = 4;
                goto LAB_00206780;
              }
              goto LAB_00206807;
            }
            stb__match(stb__dout +
                       ~((ulong)*(byte *)((long)puVar4 + 3) |
                         (ulong)*(byte *)((long)puVar4 + 1) << 0x10 | (ulong)(byte)puVar4[1] << 8),
                       (ushort)(puVar4[2] << 8 | puVar4[2] >> 8) + 1);
            puVar5 = puVar4 + 3;
          }
          else {
            stb__lit((uchar *)(puVar4 + 1),
                     ((uint)bVar6 * 0x100 + (uint)*(byte *)((long)puVar4 + 1)) - 0x7ff);
            uVar3 = (ulong)(ushort)(*puVar4 << 8 | *puVar4 >> 8);
            lVar1 = -0x7fd;
LAB_00206780:
            puVar5 = (ushort *)((long)puVar4 + uVar3 + lVar1);
            if (puVar5 == puVar4) {
              bVar6 = (byte)*puVar4;
LAB_00206807:
              if ((bVar6 != 5) || (*(byte *)((long)puVar4 + 1) != 0xfa)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                              ,0xfed,
                              "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                             );
              }
              if (stb__dout != puVar8) {
                __assert_fail("stb__dout == output + olen",
                              "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                              ,0xfe7,
                              "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                             );
              }
              goto LAB_0020682d;
            }
          }
        }
        else {
          uVar3 = -(ulong)(((uint)*(byte *)((long)puVar4 + 1) * 0x100 +
                           ((uint)(byte)puVar4[1] | (uint)bVar6 << 0x10)) - 0xfffff);
          uVar7 = (uint)(ushort)(*(ushort *)((long)puVar4 + 3) << 8 |
                                *(ushort *)((long)puVar4 + 3) >> 8);
LAB_002066ce:
          stb__match(stb__dout + uVar3,uVar7 + 1);
          puVar5 = (ushort *)((long)puVar4 + 5);
        }
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar4 + 1) * 0x100 +
                            ((uint)(byte)puVar4[1] | (uint)bVar6 << 0x10)) - 0x17ffff),
                   *(byte *)((long)puVar4 + 3) + 1);
        puVar5 = puVar4 + 2;
      }
    }
    else if ((char)bVar6 < '\0') {
      stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar4 + 1),uVar7 - 0x7f);
      puVar5 = puVar4 + 1;
    }
    else {
      if (bVar6 < 0x40) {
        stb__lit((byte *)((long)puVar4 + 1),uVar7 - 0x1f);
        uVar3 = (ulong)(byte)*puVar4;
        lVar1 = -0x1e;
        goto LAB_00206780;
      }
      stb__match(stb__dout +
                 -(ulong)(((uint)*(byte *)((long)puVar4 + 1) + (uint)bVar6 * 0x100) - 0x3fff),
                 (byte)puVar4[1] + 1);
      puVar5 = (ushort *)((long)puVar4 + 3);
    }
    puVar4 = puVar5;
    if (puVar8 < stb__dout) {
      __assert_fail("stb__dout <= output + olen",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xff1,
                    "unsigned int stb_decompress(unsigned char *, const unsigned char *, unsigned int)"
                   );
    }
  } while( true );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}